

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

Gia_Obj_t * Gia_ObjRiToRo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  if (((int)(uint)*(undefined8 *)pObj < 0) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    iVar2 = Gia_ObjCioId(pObj);
    iVar1 = p->vCos->nSize;
    if (iVar1 - p->nRegs <= iVar2) {
      iVar2 = p->vCis->nSize;
      iVar3 = Gia_ObjCioId(pObj);
      pGVar4 = Gia_ManCi(p,(iVar2 - iVar1) + iVar3);
      return pGVar4;
    }
  }
  __assert_fail("Gia_ObjIsRi(p, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline Gia_Obj_t *  Gia_ObjRiToRo( Gia_Man_t * p, Gia_Obj_t * pObj )    { assert( Gia_ObjIsRi(p, pObj) ); return Gia_ManCi(p, Gia_ManCiNum(p) - Gia_ManCoNum(p) + Gia_ObjCioId(pObj)); }